

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>_>
* TasGrid::IO::getStringToRefinementMap_abi_cxx11_(void)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>
  __l;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>_>
  *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  *local_138;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>
  local_116;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_115;
  TypeRefinement local_114 [8];
  TypeRefinement local_f4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  *local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  local_48;
  iterator local_20;
  size_type local_18;
  
  local_f0 = &local_e8;
  local_f4 = refine_classic;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  ::pair<const_char_(&)[8],_TasGrid::TypeRefinement,_true>
            (local_f0,(char (*) [8])"classic",&local_f4);
  local_f0 = &local_c0;
  local_114[3] = 1;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  ::pair<const_char_(&)[8],_TasGrid::TypeRefinement,_true>
            (local_f0,(char (*) [8])"parents",local_114 + 3);
  local_f0 = &local_98;
  local_114[2] = 2;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  ::pair<const_char_(&)[10],_TasGrid::TypeRefinement,_true>
            (local_f0,(char (*) [10])"direction",local_114 + 2);
  local_f0 = &local_70;
  local_114[1] = 3;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  ::pair<const_char_(&)[4],_TasGrid::TypeRefinement,_true>
            (local_f0,(char (*) [4])"fds",local_114 + 1);
  local_f0 = &local_48;
  local_114[0] = refine_stable;
  ::std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  ::pair<const_char_(&)[7],_TasGrid::TypeRefinement,_true>
            (local_f0,(char (*) [7])"stable",local_114);
  local_20 = &local_e8;
  local_18 = 5;
  ::std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>
  ::allocator(&local_116);
  __l._M_len = local_18;
  __l._M_array = local_20;
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>_>
  ::map(in_RDI,__l,&local_115,&local_116);
  ::std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>
  ::~allocator(&local_116);
  local_138 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
               *)&local_20;
  do {
    local_138 = local_138 + -1;
    ::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
    ::~pair(local_138);
  } while (local_138 != &local_e8);
  return in_RDI;
}

Assistant:

inline std::map<std::string, TypeRefinement> getStringToRefinementMap(){
    return std::initializer_list<std::pair<std::string const, TypeRefinement>>{
        {"classic",   refine_classic},
        {"parents",   refine_parents_first},
        {"direction", refine_direction_selective},
        {"fds",       refine_fds},
        {"stable",    refine_stable}};
}